

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

int __thiscall QOpenGLShaderProgram::uniformLocation(QOpenGLShaderProgram *this,QString *name)

{
  long lVar1;
  int iVar2;
  QOpenGLShaderProgram *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1(in_RDI);
  QByteArray::constData((QByteArray *)0x176037);
  iVar2 = uniformLocation(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8));
  QByteArray::~QByteArray((QByteArray *)0x176051);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QOpenGLShaderProgram::uniformLocation(const QString& name) const
{
    return uniformLocation(name.toLatin1().constData());
}